

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.h
# Opt level: O0

QString * __thiscall QStringDecoder::decodeAsString(QStringDecoder *this,QByteArrayView in)

{
  qsizetype qVar1;
  QChar *pQVar2;
  long lVar3;
  storage_type *in_RCX;
  qsizetype in_RDX;
  __off_t __length;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QChar *out;
  QString *result;
  code *pcVar4;
  qsizetype in_stack_ffffffffffffff90;
  QString *this_00;
  QString *in_stack_ffffffffffffff98;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI == 0) {
    in_RSI[3] = 1;
    QString::QString((QString *)0x1e4cfe);
  }
  else {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    pcVar4 = *(code **)(*in_RSI + 0x10);
    local_18.m_size = in_RDX;
    local_18.m_data = in_RCX;
    qVar1 = QByteArrayView::size(&local_18);
    (*pcVar4)(qVar1);
    QString::QString(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (Initialization)((ulong)pcVar4 >> 0x20));
    this_00 = *(QString **)(*in_RSI + 8);
    pQVar2 = QString::data(this_00);
    lVar3 = (*(code *)this_00)(pQVar2,local_18.m_size,local_18.m_data,in_RSI + 1);
    pQVar2 = QString::constData((QString *)0x1e4dc4);
    QString::truncate(in_RDI,(char *)(lVar3 - (long)pQVar2 >> 1),__length);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString decodeAsString(QByteArrayView in)
    {
        if (!iface) {
            // ensure that hasError returns true
            state.invalidChars = 1;
            return {};
        }
        QString result(iface->toUtf16Len(in.size()), Qt::Uninitialized);
        const QChar *out = iface->toUtf16(result.data(), in, &state);
        result.truncate(out - result.constData());
        return result;
    }